

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall
duckdb::StandardBufferManager::SetTemporaryDirectory(StandardBufferManager *this,string *new_dir)

{
  mutex *__mutex;
  NotImplementedException *this_00;
  allocator local_41;
  string local_40;
  
  __mutex = &(this->temporary_directory).lock;
  ::std::mutex::lock(__mutex);
  if ((this->temporary_directory).handle.
      super_unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TemporaryDirectoryHandle_*,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      .super__Head_base<0UL,_duckdb::TemporaryDirectoryHandle_*,_false>._M_head_impl ==
      (TemporaryDirectoryHandle *)0x0) {
    ::std::__cxx11::string::_M_assign((string *)&this->temporary_directory);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,
             "Cannot switch temporary directory after the current one has been used",&local_41);
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void StandardBufferManager::SetTemporaryDirectory(const string &new_dir) {
	lock_guard<mutex> guard(temporary_directory.lock);
	if (temporary_directory.handle) {
		throw NotImplementedException("Cannot switch temporary directory after the current one has been used");
	}
	temporary_directory.path = new_dir;
}